

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::AVisitor<hiberlite::KillChildren>::pushAndSubTable
          (AVisitor<hiberlite::KillChildren> *this,string *name)

{
  Scope *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __x = &this->scope;
  std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::push_back(&(this->stack).c,__x);
  Scope::full_abi_cxx11_(&local_60,__x);
  std::operator+(&local_80,&local_60,"_");
  std::operator+(&local_40,&local_80,name);
  std::__cxx11::string::operator=((string *)__x,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::assign((char *)&(this->scope)._prefix);
  (this->scope).prefix_depth = 0;
  return;
}

Assistant:

void AVisitor<C>::pushAndSubTable(std::string name)
{
	stack.push(scope);
	scope._table=scope.full()+"_"+name;
	scope._prefix="";
	scope.prefix_depth=0;
}